

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O1

int Acb_NtkFindSupp1(Acb_Ntk_t *p,int Pivot,sat_solver *pSat,int nVars,int nDivs,Vec_Int_t *vWin,
                    Vec_Int_t *vSupp)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  lit lVar5;
  uint uVar6;
  int *piVar7;
  lit *begin;
  Vec_Int_t *pVVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  char *__assertion;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  
  vSupp->nSize = 0;
  if (Pivot < 1) {
    __assert_fail("i>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                  ,0xfe,"int Acb_ObjFanOffset(Acb_Ntk_t *, int)");
  }
  if (Pivot < (p->vObjFans).nSize) {
    iVar11 = (p->vObjFans).pArray[(uint)Pivot];
    lVar16 = (long)iVar11;
    if ((-1 < lVar16) && (iVar11 < (p->vFanSto).nSize)) {
      piVar7 = (p->vFanSto).pArray;
      if (0 < piVar7[lVar16]) {
        lVar17 = 0;
        do {
          lVar9 = lVar17 + 1;
          lVar17 = lVar17 + 1;
          Vec_IntPush(vSupp,piVar7[lVar16 + lVar9]);
        } while (lVar17 < piVar7[lVar16]);
      }
      iVar11 = vSupp->nSize;
      begin = vSupp->pArray;
      if (1 < (long)iVar11) {
        uVar12 = 1;
        uVar13 = 0;
        do {
          uVar1 = uVar13 + 1;
          uVar15 = uVar13 & 0xffffffff;
          uVar14 = uVar12;
          do {
            iVar2 = begin[uVar14];
            if (((long)iVar2 < 0) || (iVar3 = (p->vFanouts).nSize, iVar3 <= iVar2)) {
LAB_0037b3b9:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWec.h"
                            ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
            }
            iVar4 = begin[(int)uVar15];
            if (((long)iVar4 < 0) || (iVar3 <= iVar4)) goto LAB_0037b3b9;
            pVVar8 = (p->vFanouts).pArray;
            uVar10 = uVar14 & 0xffffffff;
            if (pVVar8[iVar2].nSize <= pVVar8[iVar4].nSize) {
              uVar10 = uVar15;
            }
            uVar15 = uVar10;
            uVar14 = uVar14 + 1;
          } while ((long)iVar11 != uVar14);
          lVar5 = begin[uVar13];
          begin[uVar13] = begin[(int)uVar15];
          begin[(int)uVar15] = lVar5;
          uVar12 = uVar12 + 1;
          uVar13 = uVar1;
        } while (uVar1 != iVar11 - 1);
      }
      if (0 < vSupp->nSize) {
        lVar16 = 0;
        do {
          iVar11 = begin[lVar16];
          if ((long)iVar11 < 1) {
            __assertion = "i>0";
LAB_0037b445:
            __assert_fail(__assertion,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                          ,0x109,"int Acb_ObjFunc(Acb_Ntk_t *, int)");
          }
          iVar2 = (p->vObjFunc).nSize;
          if (iVar2 < 1) {
            __assertion = "Acb_NtkHasObjFuncs(p)";
            goto LAB_0037b445;
          }
          if (iVar2 <= iVar11) goto LAB_0037b3d8;
          iVar11 = (p->vObjFunc).pArray[iVar11];
          if (iVar11 < 0) {
            __assert_fail("Acb_ObjFunc(p, iFanin) >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                          ,0x382,"void Acb_NtkRemapIntoSatVariables(Acb_Ntk_t *, Vec_Int_t *)");
          }
          begin[lVar16] = iVar11;
          lVar16 = lVar16 + 1;
        } while (lVar16 < vSupp->nSize);
      }
      if (0 < vSupp->nSize) {
        lVar16 = 0;
        do {
          iVar11 = begin[lVar16] + nVars * 2;
          if (iVar11 < 0) {
            __assert_fail("Var >= 0 && !(c >> 1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                          ,0x12e,"int Abc_Var2Lit(int, int)");
          }
          begin[lVar16] = iVar11 * 2;
          lVar16 = lVar16 + 1;
        } while (lVar16 < vSupp->nSize);
      }
      iVar11 = sat_solver_solve(pSat,begin,begin + vSupp->nSize,0,0,0,0);
      if (iVar11 != -1) {
        printf("Failed internal check at node %d.\n",(ulong)(uint)Pivot);
        __assert_fail("status == l_False",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                      ,0x39e,
                      "int Acb_NtkFindSupp1(Acb_Ntk_t *, int, sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      iVar11 = sat_solver_minimize_assumptions(pSat,vSupp->pArray,vSupp->nSize,0);
      if (vSupp->nSize < iVar11) {
        __assert_fail("p->nSize >= nSizeNew",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x2b5,"void Vec_IntShrink(Vec_Int_t *, int)");
      }
      vSupp->nSize = iVar11;
      if (0 < iVar11) {
        piVar7 = vSupp->pArray;
        lVar16 = 0;
        do {
          uVar6 = piVar7[lVar16];
          if ((int)uVar6 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                          ,0x12f,"int Abc_Lit2Var(int)");
          }
          piVar7[lVar16] = (uVar6 >> 1) + nVars * -2;
          lVar16 = lVar16 + 1;
        } while (lVar16 < vSupp->nSize);
      }
      if ((p->vObjFans).nSize <= Pivot) goto LAB_0037b3d8;
      iVar11 = (p->vObjFans).pArray[(uint)Pivot];
      if ((-1 < (long)iVar11) && (iVar11 < (p->vFanSto).nSize)) {
        return (int)(vSupp->nSize < (p->vFanSto).pArray[iVar11]);
      }
    }
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                  ,0x1b8,"int *Vec_IntEntryP(Vec_Int_t *, int)");
  }
LAB_0037b3d8:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

int Acb_NtkFindSupp1( Acb_Ntk_t * p, int Pivot, sat_solver * pSat, int nVars, int nDivs, Vec_Int_t * vWin, Vec_Int_t * vSupp )
{
    int nSuppNew, status, k, iFanin, * pFanins;
    Vec_IntClear( vSupp );
    Acb_ObjForEachFaninFast( p, Pivot, pFanins, iFanin, k )
        Vec_IntPush( vSupp, iFanin );
    Acb_NtkOrderByRefCount( p, vSupp );
    Acb_NtkRemapIntoSatVariables( p, vSupp );
    Vec_IntVars2Lits( vSupp, 2*nVars, 0 );
    status = sat_solver_solve( pSat, Vec_IntArray(vSupp), Vec_IntLimit(vSupp), 0, 0, 0, 0 );
    if ( status != l_False )
        printf( "Failed internal check at node %d.\n", Pivot );
    assert( status == l_False );
    nSuppNew = sat_solver_minimize_assumptions( pSat, Vec_IntArray(vSupp), Vec_IntSize(vSupp), 0 );
    Vec_IntShrink( vSupp, nSuppNew );
    Vec_IntLits2Vars( vSupp, -2*nVars );
    return Vec_IntSize(vSupp) < Acb_ObjFaninNum(p, Pivot);
}